

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  bool *pbVar1;
  char *local_38;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  int *n_local;
  int *m_local;
  sparse_array_n<bool,_2,_std::allocator<bool>_> *board_local;
  
  for (local_24 = 0; local_24 < (uint)*m; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < (uint)*n; local_28 = local_28 + 1) {
      pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()
                         (board,local_24,(ulong)local_28);
      if ((*pbVar1 & 1U) == 0) {
        local_38 = " ";
      }
      else {
        local_38 = "X";
      }
      print_at(local_24,local_28,local_38);
    }
  }
  return;
}

Assistant:

void print_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			print_at(
				i,j,
				board(i,j) ? "X" : " "
			);
		}
}